

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::add_callback
               (char *id,log_handler_t callback,void *user_data,Verbosity verbosity,
               close_handler_t on_close,flush_handler_t on_flush)

{
  allocator<char> local_91;
  value_type local_90;
  lock_guard<std::recursive_mutex> local_40;
  lock_guard<std::recursive_mutex> lock;
  flush_handler_t on_flush_local;
  close_handler_t on_close_local;
  Verbosity verbosity_local;
  void *user_data_local;
  log_handler_t callback_local;
  char *id_local;
  
  lock._M_device = (mutex_type *)on_flush;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_40,(mutex_type *)s_mutex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,id,&local_91);
  local_90.flush = (flush_handler_t)lock._M_device;
  local_90.indentation = 0;
  local_90.callback = callback;
  local_90.user_data = user_data;
  local_90.verbosity = verbosity;
  local_90.close = on_close;
  std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::push_back
            ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks,&local_90);
  Callback::~Callback(&local_90);
  std::allocator<char>::~allocator(&local_91);
  on_callback_change();
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_40);
  return;
}

Assistant:

void add_callback(
		const char*     id,
		log_handler_t   callback,
		void*           user_data,
		Verbosity       verbosity,
		close_handler_t on_close,
		flush_handler_t on_flush)
	{
		std::lock_guard<std::recursive_mutex> lock(s_mutex);
		s_callbacks.push_back(Callback{id, callback, user_data, verbosity, on_close, on_flush, 0});
		on_callback_change();
	}